

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

Decoration __thiscall
anon_unknown.dwarf_12b4667::TGlslangToSpvTraverser::TranslateNonUniformDecoration
          (TGlslangToSpvTraverser *this,TQualifier *qualifier)

{
  Decoration DVar1;
  Capability local_c;
  
  DVar1 = DecorationMax;
  if ((qualifier->field_0xc & 2) != 0) {
    if ((this->builder).spvVersion < 0x10500) {
      spv::Builder::addExtension(&this->builder,"SPV_EXT_descriptor_indexing");
    }
    local_c = CapabilityShaderNonUniform;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,&local_c);
    DVar1 = DecorationNonUniform;
  }
  return DVar1;
}

Assistant:

spv::Decoration TGlslangToSpvTraverser::TranslateNonUniformDecoration(const glslang::TQualifier& qualifier)
{
    if (qualifier.isNonUniform()) {
        builder.addIncorporatedExtension("SPV_EXT_descriptor_indexing", spv::Spv_1_5);
        builder.addCapability(spv::CapabilityShaderNonUniformEXT);
        return spv::DecorationNonUniformEXT;
    } else
        return spv::DecorationMax;
}